

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O1

void __thiscall
Fl_Text_Display::draw_string
          (Fl_Text_Display *this,int style,int X,int Y,int toX,char *string,int nChars)

{
  Style_Table_Entry *pSVar1;
  uint uVar2;
  int iVar3;
  Fl_Color FVar4;
  Fl_Color FVar5;
  int iVar6;
  long lVar7;
  float weight;
  uint local_48;
  uint local_44;
  
  if (((uint)style >> 8 & 1) != 0) {
    if (((uint)style >> 0xd & 1) != 0) {
      return;
    }
    clear_rect(this,style,X,Y,toX - X,this->mMaxsize);
    return;
  }
  uVar2 = style & 0xff;
  if (uVar2 == 0) {
    local_44 = this->textfont_;
    local_48 = this->textsize_;
    if (((uint)style >> 10 & 1) == 0) {
      FVar5 = (this->super_Fl_Group).super_Fl_Widget.color_;
      if (((uint)style >> 0xb & 1) == 0) {
        FVar4 = this->textcolor_;
        goto LAB_001d48f7;
      }
      FVar5 = fl_color_average(FVar5,(this->super_Fl_Group).super_Fl_Widget.color2_,
                               *(float *)(&DAT_0021cf60 +
                                         (ulong)((Fl_Text_Display *)Fl::focus_ == this) * 4));
      FVar4 = this->textcolor_;
    }
    else {
      if ((Fl_Text_Display *)Fl::focus_ == this) {
        FVar5 = (this->super_Fl_Group).super_Fl_Widget.color2_;
      }
      else {
        FVar5 = fl_color_average((this->super_Fl_Group).super_Fl_Widget.color_,
                                 (this->super_Fl_Group).super_Fl_Widget.color2_,0.4);
      }
      FVar4 = this->textcolor_;
    }
  }
  else {
    if (uVar2 < 0x41) {
      lVar7 = 0;
    }
    else {
      iVar3 = this->mNStyles + -1;
      if ((int)(uVar2 - 0x41) < this->mNStyles) {
        iVar3 = uVar2 - 0x41;
      }
      lVar7 = (long)iVar3;
    }
    pSVar1 = this->mStyleTable;
    local_44 = pSVar1[lVar7].font;
    local_48 = pSVar1[lVar7].size;
    if (((uint)style >> 10 & 1) == 0) {
      if (((uint)style >> 0xb & 1) == 0) {
        FVar5 = (this->super_Fl_Group).super_Fl_Widget.color_;
      }
      else {
        FVar5 = (this->super_Fl_Group).super_Fl_Widget.color_;
        FVar4 = (this->super_Fl_Group).super_Fl_Widget.color2_;
        if ((Fl_Text_Display *)Fl::focus_ == this) {
          weight = 0.5;
        }
        else {
          weight = 0.6;
        }
LAB_001d48d5:
        FVar5 = fl_color_average(FVar5,FVar4,weight);
      }
    }
    else {
      if ((Fl_Text_Display *)Fl::focus_ != this) {
        FVar5 = (this->super_Fl_Group).super_Fl_Widget.color_;
        FVar4 = (this->super_Fl_Group).super_Fl_Widget.color2_;
        weight = 0.4;
        goto LAB_001d48d5;
      }
      FVar5 = (this->super_Fl_Group).super_Fl_Widget.color2_;
    }
    FVar4 = pSVar1[lVar7].color;
    if (((uint)style >> 10 & 1) == 0) goto LAB_001d48f7;
  }
  FVar4 = fl_contrast(FVar4,FVar5);
LAB_001d48f7:
  iVar3 = Fl_Widget::active_r((Fl_Widget *)this);
  if (iVar3 == 0) {
    FVar4 = fl_inactive(FVar4);
    FVar5 = fl_inactive(FVar5);
  }
  if (((uint)style >> 0xd & 1) == 0) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar5);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,(ulong)(uint)X,(ulong)(uint)Y,(ulong)(uint)(toX - X),
               (ulong)(uint)this->mMaxsize);
  }
  if (((uint)style >> 0xc & 1) != 0) {
    return;
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar4);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)local_44,(ulong)local_48);
  iVar3 = this->mMaxsize;
  iVar6 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3b])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xe])
            (fl_graphics_driver,string,(ulong)(uint)nChars,(ulong)(uint)X,
             (ulong)(uint)((Y + iVar3) - iVar6));
  return;
}

Assistant:

void Fl_Text_Display::draw_string(int style,
                                  int X, int Y, int toX,
                                  const char *string, int nChars) const {
  IS_UTF8_ALIGNED(string)

  const Style_Table_Entry * styleRec;

  /* Draw blank area rather than text, if that was the request */
  if ( style & FILL_MASK ) {
    if (style & TEXT_ONLY_MASK) return;
    clear_rect( style, X, Y, toX - X, mMaxsize );
    return;
  }
  /* Set font, color, and gc depending on style.  For normal text, GCs
   for normal drawing, or drawing within a Fl_Text_Selection or highlight are
   pre-allocated and pre-configured.  For syntax highlighting, GCs are
   configured here, on the fly. */

  Fl_Font font = textfont();
  int fsize = textsize();
  Fl_Color foreground;
  Fl_Color background;

  if ( style & STYLE_LOOKUP_MASK ) {
    int si = (style & STYLE_LOOKUP_MASK) - 'A';
    if (si < 0) si = 0;
    else if (si >= mNStyles) si = mNStyles - 1;

    styleRec = mStyleTable + si;
    font  = styleRec->font;
    fsize = styleRec->size;

    if (style & PRIMARY_MASK) {
      if (Fl::focus() == (Fl_Widget*)this) {
#ifdef __APPLE__
	if (Fl::compose_state) background = color();// Mac OS: underline marked text
	else 
#endif
	background = selection_color();
	}
      else background = fl_color_average(color(), selection_color(), 0.4f);
    } else if (style & HIGHLIGHT_MASK) {
      if (Fl::focus() == (Fl_Widget*)this) background = fl_color_average(color(), selection_color(), 0.5f);
      else background = fl_color_average(color(), selection_color(), 0.6f);
    } else background = color();
    foreground = (style & PRIMARY_MASK) ? fl_contrast(styleRec->color, background) : styleRec->color;
  } else if (style & PRIMARY_MASK) {
    if (Fl::focus() == (Fl_Widget*)this) background = selection_color();
    else background = fl_color_average(color(), selection_color(), 0.4f);
    foreground = fl_contrast(textcolor(), background);
  } else if (style & HIGHLIGHT_MASK) {
    if (Fl::focus() == (Fl_Widget*)this) background = fl_color_average(color(), selection_color(), 0.5f);
    else background = fl_color_average(color(), selection_color(), 0.6f);
    foreground = fl_contrast(textcolor(), background);
  } else {
    foreground = textcolor();
    background = color();
  }

  if ( !active_r() ) {
    foreground = fl_inactive(foreground);
    background = fl_inactive(background);
  }

  if (!(style & TEXT_ONLY_MASK)) {
    fl_color( background );
    fl_rectf( X, Y, toX - X, mMaxsize );
  }
  if (!(style & BG_ONLY_MASK)) {
    fl_color( foreground );
    fl_font( font, fsize );
#if !(defined(__APPLE__) || defined(WIN32)) && USE_XFT
    // makes sure antialiased ÄÖÜ do not leak on line above
    fl_push_clip(X, Y, toX - X, mMaxsize);
#endif
    fl_draw( string, nChars, X, Y + mMaxsize - fl_descent());
#ifdef __APPLE__ // Mac OS: underline marked (= selected + Fl::compose_state != 0) text
    if (Fl::compose_state && (style & PRIMARY_MASK)) {
      fl_color( fl_color_average(foreground, background, 0.6) );
      fl_line(X, Y + mMaxsize - 1, X + fl_width(string, nChars), Y + mMaxsize - 1);
    }
#endif
#if !(defined(__APPLE__) || defined(WIN32)) && USE_XFT
    fl_pop_clip();
#endif
  }

  // CET - FIXME
  /* If any space around the character remains unfilled (due to use of
   different sized fonts for highlighting), fill in above or below
   to erase previously drawn characters */
  /*
   if (fs->ascent < mAscent)
   clear_rect( style, X, Y, toX - X, mAscent - fs->ascent);
   if (fs->descent < mDescent)
   clear_rect( style, X, Y + mAscent + fs->descent, toX - x,
   mDescent - fs->descent);
   */
  /* Underline if style is secondary Fl_Text_Selection */

  /*
   if (style & SECONDARY_MASK)
   XDrawLine(XtDisplay(mW), XtWindow(mW), gc, x,
   y + mAscent, toX - 1, Y + fs->ascent);
   */
}